

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSorterReset(sqlite3 *db,VdbeSorter *pSorter)

{
  SortSubtask *pTask;
  int i;
  VdbeSorter *pSorter_local;
  sqlite3 *db_local;
  
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = (MergeEngine *)0x0;
  for (pTask._4_4_ = 0; pTask._4_4_ < (int)(uint)pSorter->nTask; pTask._4_4_ = pTask._4_4_ + 1) {
    vdbeSortSubtaskCleanup(db,pSorter->aTask + pTask._4_4_);
    pSorter->aTask[pTask._4_4_].pSorter = pSorter;
  }
  if ((pSorter->list).aMemory == (u8 *)0x0) {
    vdbeSorterRecordFree((sqlite3 *)0x0,(pSorter->list).pList);
  }
  (pSorter->list).pList = (SorterRecord *)0x0;
  (pSorter->list).szPMA = 0;
  pSorter->bUsePMA = '\0';
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  sqlite3DbFree(db,pSorter->pUnpacked);
  pSorter->pUnpacked = (UnpackedRecord *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSorterReset(sqlite3 *db, VdbeSorter *pSorter){
  int i;
  (void)vdbeSorterJoinAll(pSorter, SQLITE_OK);
  assert( pSorter->bUseThreads || pSorter->pReader==0 );
#if SQLITE_MAX_WORKER_THREADS>0
  if( pSorter->pReader ){
    vdbePmaReaderClear(pSorter->pReader);
    sqlite3DbFree(db, pSorter->pReader);
    pSorter->pReader = 0;
  }
#endif
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = 0;
  for(i=0; i<pSorter->nTask; i++){
    SortSubtask *pTask = &pSorter->aTask[i];
    vdbeSortSubtaskCleanup(db, pTask);
    pTask->pSorter = pSorter;
  }
  if( pSorter->list.aMemory==0 ){
    vdbeSorterRecordFree(0, pSorter->list.pList);
  }
  pSorter->list.pList = 0;
  pSorter->list.szPMA = 0;
  pSorter->bUsePMA = 0;
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  sqlite3DbFree(db, pSorter->pUnpacked);
  pSorter->pUnpacked = 0;
}